

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_do_ctr(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  long lVar1;
  long lVar2;
  gost_ctx *c_00;
  ossl_gost_cipher_ctx *in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  undefined8 in_RDI;
  bool bVar3;
  size_t lasted;
  size_t i;
  size_t blocks;
  uint num;
  uchar *iv;
  uchar *buf;
  ossl_gost_cipher_ctx *c;
  size_t j;
  uchar *out_ptr;
  uchar *in_ptr;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar4;
  ossl_gost_cipher_ctx *ctx_00;
  gost_ctx *in_00;
  ossl_gost_cipher_ctx *poVar5;
  uint local_54;
  ulong local_38;
  byte *local_30;
  byte *local_28;
  
  lVar1 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  lVar2 = EVP_CIPHER_CTX_buf_noconst(in_RDI);
  EVP_CIPHER_CTX_iv_noconst(in_RDI);
  local_54 = EVP_CIPHER_CTX_get_num(in_RDI);
  ctx_00 = in_RCX;
  local_30 = in_RSI;
  local_28 = in_RDX;
  for (; bVar3 = (local_54 & 7) != 0, uVar4 = bVar3 && ctx_00 != (ossl_gost_cipher_ctx *)0x0,
      bVar3 && ctx_00 != (ossl_gost_cipher_ctx *)0x0; local_54 = local_54 + 1) {
    *local_30 = *local_28 ^ *(byte *)(lVar2 + (ulong)(local_54 & 7));
    ctx_00 = (ossl_gost_cipher_ctx *)((long)&ctx_00[-1].omac_ctx + 7);
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  c_00 = (gost_ctx *)((ulong)ctx_00 >> 3);
  for (in_00 = (gost_ctx *)0x0; in_00 < c_00; in_00 = (gost_ctx *)((long)in_00->master_key + 1)) {
    apply_acpkm_magma(ctx_00,(uint *)CONCAT17(uVar4,in_stack_ffffffffffffff88));
    magmacrypt(c_00,(byte *)in_00,(byte *)ctx_00);
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      local_30[local_38] = *(byte *)(lVar2 + local_38) ^ local_28[local_38];
    }
    ctr64_inc((uchar *)0x11814b);
    *(int *)(lVar1 + 4) = *(int *)(lVar1 + 4) + 8;
    local_28 = local_28 + 8;
    local_30 = local_30 + 8;
    local_54 = local_54 + 8;
    ctx_00 = (ossl_gost_cipher_ctx *)&ctx_00[-1].omac_ctx;
  }
  if (ctx_00 != (ossl_gost_cipher_ctx *)0x0) {
    apply_acpkm_magma(ctx_00,(uint *)CONCAT17(uVar4,in_stack_ffffffffffffff88));
    magmacrypt(c_00,(byte *)in_00,(byte *)ctx_00);
    for (poVar5 = (ossl_gost_cipher_ctx *)0x0; poVar5 < ctx_00;
        poVar5 = (ossl_gost_cipher_ctx *)((long)&poVar5->paramNID + 1)) {
      local_30[(long)poVar5] = poVar5->kdf_seed[lVar2 + -0xc] ^ local_28[(long)poVar5];
    }
    ctr64_inc((uchar *)0x118230);
    *(int *)(lVar1 + 4) = *(int *)(lVar1 + 4) + 8;
    local_54 = local_54 + (int)ctx_00;
  }
  EVP_CIPHER_CTX_set_num(in_RDI,local_54);
  return (int)in_RCX;
}

Assistant:

static int magma_cipher_do_ctr(EVP_CIPHER_CTX *ctx, unsigned char *out,
                               const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t j;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    unsigned int num = EVP_CIPHER_CTX_num(ctx);
    size_t blocks, i, lasted = inl;
/* Process partial blocks */
    while ((num & MAGMA_BLOCK_MASK) && lasted) {
        *out_ptr++ = *in_ptr++ ^ buf[num & MAGMA_BLOCK_MASK];
        --lasted;
        num++;
    }
    blocks = lasted / MAGMA_BLOCK_SIZE;

/* Process full blocks */
    for (i = 0; i < blocks; i++) {
        apply_acpkm_magma(c, &num);
        magmacrypt(&(c->cctx), iv, buf);
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        ctr64_inc(iv);
        c->count += MAGMA_BLOCK_SIZE;
        in_ptr += MAGMA_BLOCK_SIZE;
        out_ptr += MAGMA_BLOCK_SIZE;
        num += MAGMA_BLOCK_SIZE;
        lasted -= MAGMA_BLOCK_SIZE;
    }

/* Process the rest of plaintext */
    if (lasted > 0) {
        apply_acpkm_magma(c, &num);
        magmacrypt(&(c->cctx), iv, buf);

        for (i = 0; i < lasted; i++)
            out_ptr[i] = buf[i] ^ in_ptr[i];
        ctr64_inc(iv);
        c->count += 8;
        num += lasted;
    }
    EVP_CIPHER_CTX_set_num(ctx, num);

    return inl;
}